

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zeSamplerCreate
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_sampler_desc_t *desc,
          ze_sampler_handle_t *phSampler)

{
  Logger *this;
  long *plVar1;
  ze_result_t result;
  ze_result_t zVar2;
  size_t i;
  long lVar3;
  long lVar4;
  long lVar5;
  allocator local_61;
  ze_context_handle_t local_60;
  code *local_58;
  string local_50;
  
  lVar4 = context;
  this = *(Logger **)(context + 0xd50);
  local_60 = hContext;
  std::__cxx11::string::string
            ((string *)&local_50,"zeSamplerCreate(hContext, hDevice, desc, phSampler)",&local_61);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar4 + 0x5d0) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar5 = *(long *)(lVar4 + 0xd38) - *(long *)(lVar4 + 0xd30) >> 3;
    lVar3 = 0;
    local_58 = *(code **)(lVar4 + 0x5d0);
    do {
      if (lVar5 == lVar3) {
        if ((*(char *)(context + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeSamplerCreatePrologue
                               (*(ZEHandleLifetimeValidation **)(context + 0xd48),local_60,hDevice,
                                desc,phSampler), result == ZE_RESULT_SUCCESS)) {
          zVar2 = (*local_58)(local_60,hDevice,desc,phSampler);
          lVar4 = 0;
          goto LAB_00153725;
        }
        break;
      }
      plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar3 * 8);
      result = (**(code **)(*plVar1 + 0x860))(plVar1,local_60,hDevice,desc,phSampler);
      lVar3 = lVar3 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_00153762;
  while( true ) {
    plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar4 * 8);
    result = (**(code **)(*plVar1 + 0x868))(plVar1,local_60,hDevice,desc,phSampler,zVar2);
    lVar4 = lVar4 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_00153725:
    lVar3 = context;
    if (lVar5 == lVar4) {
      result = zVar2;
      if (((zVar2 == ZE_RESULT_SUCCESS) && (phSampler != (ze_sampler_handle_t *)0x0)) &&
         (*(char *)(context + 4) != '\0')) {
        HandleLifetimeValidation::addHandle
                  (*(HandleLifetimeValidation **)(context + 0xd48),*phSampler);
        HandleLifetimeValidation::addDependent
                  (*(HandleLifetimeValidation **)(lVar3 + 0xd48),local_60,*phSampler);
      }
      break;
    }
  }
LAB_00153762:
  logAndPropagateResult("zeSamplerCreate",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeSamplerCreate(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        const ze_sampler_desc_t* desc,                  ///< [in] pointer to sampler descriptor
        ze_sampler_handle_t* phSampler                  ///< [out] handle of the sampler
        )
    {
        context.logger->log_trace("zeSamplerCreate(hContext, hDevice, desc, phSampler)");

        auto pfnCreate = context.zeDdiTable.Sampler.pfnCreate;

        if( nullptr == pfnCreate )
            return logAndPropagateResult("zeSamplerCreate", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeSamplerCreatePrologue( hContext, hDevice, desc, phSampler );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeSamplerCreate", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeSamplerCreatePrologue( hContext, hDevice, desc, phSampler );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeSamplerCreate", result);
        }

        auto driver_result = pfnCreate( hContext, hDevice, desc, phSampler );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeSamplerCreateEpilogue( hContext, hDevice, desc, phSampler ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeSamplerCreate", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phSampler){
                context.handleLifetime->addHandle( *phSampler );
                context.handleLifetime->addDependent( hContext, *phSampler );

            }
        }
        return logAndPropagateResult("zeSamplerCreate", driver_result);
    }